

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::PrintCommandTrace(cmMakefile *this,cmListFileFunction *lff)

{
  bool bVar1;
  ostream *poVar2;
  pointer pcVar3;
  pointer pcVar4;
  string temp;
  long *local_1c8;
  long local_1b8 [2];
  ostringstream msg;
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
  GetExecutionFilePath_abi_cxx11_(&temp,this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&msg,temp._M_dataplus._M_p,temp._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(",1);
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"):  ",4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)temp._M_dataplus._M_p != &temp.field_2) {
    operator_delete(temp._M_dataplus._M_p,
                    CONCAT71(temp.field_2._M_allocated_capacity._1_7_,temp.field_2._M_local_buf[0])
                    + 1);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&msg,(lff->super_cmCommandContext).Name._M_dataplus._M_p,
                      (lff->super_cmCommandContext).Name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(",1);
  bVar1 = this->GlobalGenerator->CMakeInstance->TraceExpand;
  temp._M_dataplus._M_p = (pointer)&temp.field_2;
  temp._M_string_length = 0;
  temp.field_2._M_local_buf[0] = '\0';
  pcVar3 = (lff->Arguments).
           super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar3 != (lff->Arguments).
                super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      pcVar4 = pcVar3;
      if (bVar1 != false) {
        std::__cxx11::string::_M_assign((string *)&temp);
        ExpandVariablesInString(this,&temp,false,false,false,(char *)0x0,-1,false,false);
        pcVar4 = (pointer)&temp;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&msg,(pcVar4->Value)._M_dataplus._M_p,(pcVar4->Value)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&msg," ",1);
      pcVar3 = pcVar3 + 1;
    } while (pcVar3 != (lff->Arguments).
                       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&msg,")",1);
  std::__cxx11::stringbuf::str();
  cmSystemTools::Message((char *)local_1c8,(char *)0x0);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)temp._M_dataplus._M_p != &temp.field_2) {
    operator_delete(temp._M_dataplus._M_p,
                    CONCAT71(temp.field_2._M_allocated_capacity._1_7_,temp.field_2._M_local_buf[0])
                    + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void cmMakefile::PrintCommandTrace(const cmListFileFunction& lff) const
{
  std::ostringstream msg;
  msg << this->GetExecutionFilePath() << "(" << lff.Line << "):  ";
  msg << lff.Name << "(";
  bool expand = this->GetCMakeInstance()->GetTraceExpand();
  std::string temp;
  for(std::vector<cmListFileArgument>::const_iterator i =
        lff.Arguments.begin(); i != lff.Arguments.end(); ++i)
    {
    if (expand)
      {
      temp = i->Value;
      this->ExpandVariablesInString(temp);
      msg << temp;
      }
    else
      {
      msg << i->Value;
      }
    msg << " ";
    }
  msg << ")";
  cmSystemTools::Message(msg.str().c_str());
}